

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afdummy.c
# Opt level: O2

FT_Error af_dummy_hints_apply(FT_UInt glyph_index,AF_GlyphHints hints,FT_Outline *outline)

{
  FT_Error FVar1;
  
  FVar1 = af_glyph_hints_reload(hints,outline);
  if (FVar1 == 0) {
    af_glyph_hints_save(hints,outline);
  }
  return FVar1;
}

Assistant:

static FT_Error
  af_dummy_hints_apply( FT_UInt        glyph_index,
                        AF_GlyphHints  hints,
                        FT_Outline*    outline )
  {
    FT_Error  error;

    FT_UNUSED( glyph_index );


    error = af_glyph_hints_reload( hints, outline );
    if ( !error )
      af_glyph_hints_save( hints, outline );

    return error;
  }